

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

curl_slist * Curl_cookie_list(Curl_easy *data)

{
  curl_slist *list;
  char *data_00;
  curl_slist *pcVar1;
  Cookie *co;
  
  co = (Cookie *)data->cookies;
  if ((co != (Cookie *)0x0) && (co->path != (char *)0x0)) {
    pcVar1 = (curl_slist *)0x0;
    do {
      do {
        list = pcVar1;
        co = co->next;
        if (co == (Cookie *)0x0) {
          return list;
        }
        pcVar1 = list;
      } while (co->domain == (char *)0x0);
      data_00 = get_netscape_format(co);
      if (data_00 == (char *)0x0) goto LAB_0010e0b1;
      pcVar1 = Curl_slist_append_nodup(list,data_00);
    } while (pcVar1 != (curl_slist *)0x0);
    (*Curl_cfree)(data_00);
LAB_0010e0b1:
    curl_slist_free_all(list);
  }
  return (curl_slist *)0x0;
}

Assistant:

struct curl_slist *Curl_cookie_list(struct Curl_easy *data)
{
  struct curl_slist *list = NULL;
  struct curl_slist *beg;
  struct Cookie *c;
  char *line;

  if((data->cookies == NULL) ||
      (data->cookies->numcookies == 0))
    return NULL;

  for(c = data->cookies->cookies; c; c = c->next) {
    if(!c->domain)
      continue;
    line = get_netscape_format(c);
    if(!line) {
      curl_slist_free_all(list);
      return NULL;
    }
    beg = Curl_slist_append_nodup(list, line);
    if(!beg) {
      free(line);
      curl_slist_free_all(list);
      return NULL;
    }
    list = beg;
  }

  return list;
}